

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

uint32_t raplcap_get_num_die(raplcap *rc,uint32_t pkg)

{
  int iVar1;
  int *piVar2;
  uint32_t local_38;
  uint local_34;
  uint32_t n_die;
  uint32_t n_pkg;
  raplcap_msr_sys_ctx *sys;
  raplcap_msr *state;
  raplcap *prStack_18;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  prStack_18 = rc;
  if (rc == (raplcap *)0x0) {
    prStack_18 = &rc_default;
  }
  sys = (raplcap_msr_sys_ctx *)prStack_18->state;
  if (sys == (raplcap_msr_sys_ctx *)0x0) {
    _n_die = (raplcap_msr_sys_ctx *)0x0;
  }
  else {
    _n_die = *(raplcap_msr_sys_ctx **)&sys[2].n_fds;
  }
  state._4_4_ = pkg;
  iVar1 = msr_sys_get_num_pkg_die(_n_die,&local_34,&local_38);
  if (iVar1 == 0) {
    if (state._4_4_ < local_34) {
      rc_local._4_4_ = local_38;
    }
    else {
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      fprintf(_stderr,"Package %u not in range [0, %u)\n",(ulong)state._4_4_,(ulong)local_34);
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      rc_local._4_4_ = 0;
    }
  }
  else {
    rc_local._4_4_ = 0;
  }
  return rc_local._4_4_;
}

Assistant:

uint32_t raplcap_get_num_die(const raplcap* rc, uint32_t pkg) {
  const raplcap_msr* state;
  const raplcap_msr_sys_ctx* sys;
  uint32_t n_pkg;
  uint32_t n_die;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    sys = state->sys;
  } else {
    sys = NULL;
  }
  if (msr_sys_get_num_pkg_die(sys, &n_pkg, &n_die)) {
    return 0;
  }
  if (pkg >= n_pkg) {
    raplcap_log(ERROR, "Package %"PRIu32" not in range [0, %"PRIu32")\n", pkg, n_pkg);
    errno = EINVAL;
    return 0;
  }
  return n_die;
}